

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int nonce_function_rfc6979
              (uchar *nonce32,uchar *msg32,uchar *key32,uchar *algo16,void *data,uint counter)

{
  undefined8 uVar1;
  uint uVar2;
  size_t extraout_RDX;
  size_t outlen;
  size_t extraout_RDX_00;
  uchar keydata [112];
  secp256k1_rfc6979_hmac_sha256 rng;
  undefined8 local_e8 [14];
  secp256k1_rfc6979_hmac_sha256 local_78;
  
  local_e8[0] = *(undefined8 *)key32;
  local_e8[1] = *(undefined8 *)(key32 + 8);
  local_e8[2] = *(undefined8 *)(key32 + 0x10);
  local_e8[3] = *(undefined8 *)(key32 + 0x18);
  local_e8[4] = *(undefined8 *)msg32;
  local_e8[5] = *(undefined8 *)(msg32 + 8);
  local_e8[6] = *(undefined8 *)(msg32 + 0x10);
  local_e8[7] = *(undefined8 *)(msg32 + 0x18);
  if (data == (void *)0x0) {
    uVar2 = 0x40;
  }
  else {
    local_e8[8] = *data;
    local_e8[9] = *(undefined8 *)((long)data + 8);
    local_e8[10] = *(undefined8 *)((long)data + 0x10);
    local_e8[0xb] = *(undefined8 *)((long)data + 0x18);
    uVar2 = 0x60;
  }
  if (algo16 != (uchar *)0x0) {
    uVar1 = *(undefined8 *)(algo16 + 8);
    *(undefined8 *)((long)local_e8 + (ulong)uVar2) = *(undefined8 *)algo16;
    *(undefined8 *)((long)local_e8 + (ulong)uVar2 + 8) = uVar1;
    uVar2 = uVar2 | 0x10;
  }
  secp256k1_rfc6979_hmac_sha256_initialize(&local_78,(uchar *)local_e8,(ulong)uVar2);
  local_e8[0xc] = 0;
  local_e8[0xd] = 0;
  local_e8[10] = 0;
  local_e8[0xb] = 0;
  local_e8[8] = 0;
  local_e8[9] = 0;
  local_e8[6] = 0;
  local_e8[7] = 0;
  local_e8[4] = 0;
  local_e8[5] = 0;
  local_e8[2] = 0;
  local_e8[3] = 0;
  local_e8[0] = 0;
  local_e8[1] = 0;
  uVar2 = 0;
  outlen = extraout_RDX;
  do {
    secp256k1_rfc6979_hmac_sha256_generate(&local_78,nonce32,outlen);
    uVar2 = uVar2 + 1;
    outlen = extraout_RDX_00;
  } while (uVar2 <= counter);
  return 1;
}

Assistant:

static int nonce_function_rfc6979(unsigned char *nonce32, const unsigned char *msg32, const unsigned char *key32, const unsigned char *algo16, void *data, unsigned int counter) {
   unsigned char keydata[112];
   unsigned int offset = 0;
   secp256k1_rfc6979_hmac_sha256 rng;
   unsigned int i;
   /* We feed a byte array to the PRNG as input, consisting of:
    * - the private key (32 bytes) and message (32 bytes), see RFC 6979 3.2d.
    * - optionally 32 extra bytes of data, see RFC 6979 3.6 Additional Data.
    * - optionally 16 extra bytes with the algorithm name.
    * Because the arguments have distinct fixed lengths it is not possible for
    *  different argument mixtures to emulate each other and result in the same
    *  nonces.
    */
   buffer_append(keydata, &offset, key32, 32);
   buffer_append(keydata, &offset, msg32, 32);
   if (data != NULL) {
       buffer_append(keydata, &offset, data, 32);
   }
   if (algo16 != NULL) {
       buffer_append(keydata, &offset, algo16, 16);
   }
   secp256k1_rfc6979_hmac_sha256_initialize(&rng, keydata, offset);
   memset(keydata, 0, sizeof(keydata));
   for (i = 0; i <= counter; i++) {
       secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
   }
   secp256k1_rfc6979_hmac_sha256_finalize(&rng);
   return 1;
}